

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionObservationHistoryTree.cpp
# Opt level: O1

ActionObservationHistoryTree * __thiscall
ActionObservationHistoryTree::GetSuccessor(ActionObservationHistoryTree *this,Index aI,Index oI)

{
  TreeNode<ActionObservationHistory> *this_00;
  ActionObservationHistoryTree *pAVar1;
  E *this_01;
  
  if (this->_m_nodeType != O_SUC) {
    this_00 = TreeNode<ActionObservationHistory>::GetSuccessor
                        (&this->super_TreeNode<ActionObservationHistory>,(ulong)aI);
    pAVar1 = (ActionObservationHistoryTree *)
             TreeNode<ActionObservationHistory>::GetSuccessor(this_00,(ulong)oI);
    return pAVar1;
  }
  this_01 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_01,
       "Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node"
      );
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

ActionObservationHistoryTree* ActionObservationHistoryTree::GetSuccessor(Index 
        aI, Index oI)
{
    if (_m_nodeType == O_SUC)
        throw E("Trying ActionObservationHistoryTree::SetSuccessor(Index aI, Index oI, ActionObservationHistoryTree* suc)  on O_SUC node");

    ActionObservationHistoryTree* suc;
    try {
        suc = (ActionObservationHistoryTree*)
        //we only put ActionObservationHistoryTree*'s in here so this cast
        //should be allowed.
        this->TreeNode<ActionObservationHistory>::GetSuccessor(aI) //the oNode
        ->TreeNode<ActionObservationHistory>::GetSuccessor(oI);
    } catch(EInvalidIndex& e) {
        // successor does not exist, so we should create it, see
        // JointActionObservationHistoryTree::GetSuccessor for
        // inspiration
        throw(E("ActionObservationHistoryTree::GetSuccessor generation of successors on the fly not yet implemented"));
    }

    return(suc);
}